

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int next_token(parse_state *state)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  int t;
  char *s;
  char *x;
  parse_state *state_local;
  
  x = state->ptr;
  if (state->nexttoken != 0) {
    iVar2 = state->nexttoken;
    state->nexttoken = 0;
    return iVar2;
  }
  do {
    switch(*x) {
    case '\0':
      state->ptr = x;
      return 0;
    default:
      s = x;
      state->text = x;
      goto LAB_00107d46;
    case '\t':
    case '\r':
    case ' ':
      x = x + 1;
      break;
    case '\n':
      state->line = state->line + 1;
      state->ptr = x + 1;
      return 2;
    case '#':
      while( true ) {
        bVar4 = false;
        if (*x != '\0') {
          bVar4 = *x != '\n';
        }
        if (!bVar4) break;
        x = x + 1;
      }
      state->line = state->line + 1;
      state->ptr = x;
      return 2;
    }
  } while( true );
LAB_00107d46:
  cVar1 = *x;
  pcVar3 = x;
  if (cVar1 == '\0') {
LAB_00107d0f:
    x = pcVar3;
    state->ptr = x;
    *s = '\0';
    return 1;
  }
  if (cVar1 == '\t') {
LAB_00107da6:
    pcVar3 = x + 1;
    goto LAB_00107d0f;
  }
  if (cVar1 == '\n') {
    state->nexttoken = 2;
    pcVar3 = x + 1;
    goto LAB_00107d0f;
  }
  if ((cVar1 == '\r') || (cVar1 == ' ')) goto LAB_00107da6;
  if (cVar1 == '\"') {
    while( true ) {
      x = pcVar3 + 1;
      if (*x == '\0') {
        state->ptr = x;
        return 0;
      }
      if (*x == '\"') break;
      *s = *x;
      s = s + 1;
      pcVar3 = x;
    }
    x = pcVar3 + 2;
    goto LAB_00107d46;
  }
  if (cVar1 == '\\') {
    pcVar3 = x + 1;
    cVar1 = *pcVar3;
    if (cVar1 == '\0') goto LAB_00107d0f;
    if (cVar1 != '\n') {
      if (cVar1 != '\r') {
        if (cVar1 == '\\') {
          *s = '\\';
          x = pcVar3;
        }
        else if (cVar1 == 'n') {
          *s = '\n';
          x = pcVar3;
        }
        else if (cVar1 == 'r') {
          *s = '\r';
          x = pcVar3;
        }
        else if (cVar1 == 't') {
          *s = '\t';
          x = pcVar3;
        }
        else {
          *s = *pcVar3;
          x = x + 2;
        }
        s = s + 1;
        goto LAB_00107d46;
      }
      if (x[2] != '\n') {
        x = x + 2;
        goto LAB_00107d46;
      }
    }
    state->line = state->line + 1;
    x = x + 2;
    while( true ) {
      bVar4 = true;
      if (*x != ' ') {
        bVar4 = *x == '\t';
      }
      if (!bVar4) break;
      x = x + 1;
    }
    goto LAB_00107d46;
  }
  *s = *x;
  s = s + 1;
  x = x + 1;
  goto LAB_00107d46;
}

Assistant:

int next_token(struct parse_state *state)
{
    char *x = state->ptr;
    char *s;

    if (state->nexttoken) {
        int t = state->nexttoken;
        state->nexttoken = 0;
        return t;
    }

    for (;;) {
        switch (*x) {
        case 0:
            state->ptr = x;
            return T_EOF;
        case '\n':
            state->line++;
            x++;
            state->ptr = x;
            return T_NEWLINE;
        case ' ':
        case '\t':
        case '\r':
            x++;
            continue;
        case '#':
            while (*x && (*x != '\n')) x++;
            state->line++;
            state->ptr = x;
            return T_NEWLINE;
        default:
            goto text;
        }
    }

textdone:
    state->ptr = x;
    *s = 0;
    return T_TEXT;
text:
    state->text = s = x;
textresume:
    for (;;) {
        switch (*x) {
        case 0:
            goto textdone;
        case ' ':
        case '\t':
        case '\r':
            x++;
            goto textdone;
        case '\n':
            state->nexttoken = T_NEWLINE;
            x++;
            goto textdone;
        case '"':
            x++;
            for (;;) {
                switch (*x) {
                case 0:
                        /* unterminated quoted thing */
                    state->ptr = x;
                    return T_EOF;
                case '"':
                    x++;
                    goto textresume;
                default:
                    *s++ = *x++;
                }
            }
            break;
        case '\\':
            x++;
            switch (*x) {
            case 0:
                goto textdone;
            case 'n':
                *s++ = '\n';
                break;
            case 'r':
                *s++ = '\r';
                break;
            case 't':
                *s++ = '\t';
                break;
            case '\\':
                *s++ = '\\';
                break;
            case '\r':
                    /* \ <cr> <lf> -> line continuation */
                if (x[1] != '\n') {
                    x++;
                    continue;
                }
            case '\n':
                    /* \ <lf> -> line continuation */
                state->line++;
                x++;
                    /* eat any extra whitespace */
                while((*x == ' ') || (*x == '\t')) x++;
                continue;
            default:
                    /* unknown escape -- just copy */
                *s++ = *x++;
            }
            continue;
        default:
            *s++ = *x++;
        }
    }
    return T_EOF;
}